

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  Offset OVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  Offset OVar4;
  ulong uVar5;
  Type type_local;
  string local_50;
  
  if (this->in_function_body == true) {
    OVar4 = this->current_opcode_offset;
    uVar3 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset - OVar4;
    if (((this->super_BinaryReaderObjdumpBase).options_)->section_offsets == false) {
      OVar1 = 0;
    }
    else {
      OVar1 = (this->super_BinaryReaderObjdumpBase).section_starts_[10];
    }
    type_local = type;
    printf(" %06zx:",OVar4 - OVar1);
    uVar2 = 9;
    if (uVar3 < 9) {
      uVar2 = uVar3;
    }
    while (uVar5 = uVar3, uVar2 != 0) {
      printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[OVar4]);
      OVar4 = OVar4 + 1;
      uVar2 = uVar2 - 1;
    }
    for (; uVar5 < 9; uVar5 = uVar5 + 1) {
      printf("   ");
    }
    printf(" | local[");
    if (count != 0) {
      printf("%u",(ulong)this->local_index_);
      if (count != 1) {
        printf("..%u",(ulong)((count + this->local_index_) - 1));
      }
      this->local_index_ = this->local_index_ + count;
    }
    Type::GetName_abi_cxx11_(&local_50,&type_local);
    printf("] type=%s\n",local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    OVar4 = uVar3 + this->current_opcode_offset;
    this->last_opcode_end = OVar4;
    this->current_opcode_offset = OVar4;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", GetPrintOffset(offset));
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[");
  if (count > 0) {
    printf("%" PRIindex, local_index_);

    if (count != 1) {
      printf("..%" PRIindex "", local_index_ + count - 1);
    }
    local_index_ += count;
  }
  printf("] type=%s\n", type.GetName().c_str());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}